

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O1

bool __thiscall
Assimp::Ogre::OgreImporter::ReadPass
          (OgreImporter *this,string *passName,stringstream *ss,aiMaterial *material)

{
  size_t sVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  Logger *pLVar5;
  char *pcVar6;
  string *psVar7;
  long lVar8;
  string linePart;
  string partAmbient;
  float b;
  float g;
  float r;
  string partEmissive;
  string partSpecular;
  string partDiffuse;
  aiColor3D color;
  string partTextureUnit;
  string textureUnitName;
  char *local_2d0;
  size_t local_2c8;
  char local_2c0;
  undefined7 uStack_2bf;
  long *local_2b0;
  size_t local_2a8;
  long local_2a0 [2];
  float local_290;
  float local_28c;
  float local_288;
  undefined4 local_284;
  long *local_280;
  size_t local_278;
  long local_270 [2];
  long *local_260;
  size_t local_258;
  long local_250 [2];
  long *local_240;
  size_t local_238;
  long local_230 [2];
  char *local_220;
  undefined8 local_218;
  char local_210;
  undefined7 uStack_20f;
  float local_1fc;
  float local_1f8;
  float local_1f4;
  long *local_1f0;
  size_t local_1e8;
  long local_1e0 [2];
  OgreImporter *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_2d0 = &local_2c0;
  local_2c8 = 0;
  local_2c0 = '\0';
  local_1d0 = this;
  piVar4 = std::operator>>((istream *)ss,(string *)&local_2d0);
  local_284 = (undefined4)CONCAT71((int7)((ulong)piVar4 >> 8),1);
  if (local_2c8 == DAT_009c40e8) {
    if (local_2c8 == 0) {
      local_284 = 0;
    }
    else {
      iVar3 = bcmp(local_2d0,partBlockStart_abi_cxx11_,local_2c8);
      local_284 = CONCAT31((int3)((uint)iVar3 >> 8),iVar3 != 0);
    }
  }
  if ((char)local_284 == '\0') {
    pLVar5 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[9]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [9])"  pass \'");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(passName->_M_dataplus)._M_p,passName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar5,(char *)local_2b0);
    if (local_2b0 != local_2a0) {
      operator_delete(local_2b0,local_2a0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_2b0 = local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"ambient","");
    local_240 = local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"diffuse","");
    local_260 = local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"specular","");
    local_280 = local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"emissive","");
    local_1f0 = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"texture_unit","");
LAB_00486941:
    if (local_2c8 == DAT_009c4108) {
      if (local_2c8 == 0) goto LAB_00486de2;
      iVar3 = bcmp(local_2d0,partBlockEnd_abi_cxx11_,local_2c8);
      if (iVar3 == 0) goto LAB_00486de2;
    }
    std::operator>>((istream *)ss,(string *)&local_2d0);
    sVar1 = local_2c8;
    if (local_2c8 == DAT_009c40c8) {
      if (local_2c8 != 0) {
        iVar3 = bcmp(local_2d0,partComment_abi_cxx11_,local_2c8);
        if (iVar3 != 0) goto LAB_004869af;
      }
      local_220 = &local_210;
      local_218 = 0;
      local_210 = '\0';
      cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)ss + -0x18) + (char)ss);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)ss,(string *)&local_220,cVar2);
      if (local_220 != &local_210) {
        lVar8 = CONCAT71(uStack_20f,local_210);
        pcVar6 = local_220;
LAB_00486dd5:
        operator_delete(pcVar6,lVar8 + 1);
      }
      goto LAB_00486941;
    }
LAB_004869af:
    if (sVar1 != local_2a8) {
LAB_004869d9:
      if (sVar1 == local_238) {
        if (sVar1 != 0) {
          iVar3 = bcmp(local_2d0,local_240,sVar1);
          if (iVar3 != 0) goto LAB_00486a09;
        }
        goto LAB_00486b1a;
      }
LAB_00486a09:
      if (sVar1 == local_258) {
        if (sVar1 != 0) {
          iVar3 = bcmp(local_2d0,local_260,sVar1);
          if (iVar3 != 0) goto LAB_00486a36;
        }
        goto LAB_00486b1a;
      }
LAB_00486a36:
      if (sVar1 == local_278) {
        if (sVar1 != 0) {
          iVar3 = bcmp(local_2d0,local_280,sVar1);
          if (iVar3 != 0) goto LAB_00486a60;
        }
        goto LAB_00486b1a;
      }
LAB_00486a60:
      if (sVar1 == local_1e8) {
        if (sVar1 != 0) {
          iVar3 = bcmp(local_2d0,local_1f0,sVar1);
          if (iVar3 != 0) goto LAB_00486941;
        }
        local_1a8._0_8_ = local_1a8 + 0x10;
        local_1a8._8_8_ = 0;
        local_1a8[0x10] = '\0';
        cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)ss + -0x18) + (char)ss);
        psVar7 = (string *)local_1a8;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)ss,(string *)local_1a8,cVar2);
        Trim((string *)local_1a8,SUB81(psVar7,0));
        ReadTextureUnit(local_1d0,(string *)local_1a8,ss,material);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          lVar8 = CONCAT71(local_1a8._17_7_,local_1a8[0x10]);
          pcVar6 = (char *)local_1a8._0_8_;
          goto LAB_00486dd5;
        }
      }
      goto LAB_00486941;
    }
    if (sVar1 != 0) {
      iVar3 = bcmp(local_2d0,local_2b0,sVar1);
      if (iVar3 != 0) goto LAB_004869d9;
    }
LAB_00486b1a:
    piVar4 = std::istream::_M_extract<float>((float *)ss);
    piVar4 = std::istream::_M_extract<float>((float *)piVar4);
    std::istream::_M_extract<float>((float *)piVar4);
    local_1fc = local_288;
    local_1f8 = local_28c;
    local_1f4 = local_290;
    pLVar5 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[4]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [4])0x73d080);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_2d0,local_2c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    std::ostream::_M_insert<double>((double)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    std::ostream::_M_insert<double>((double)local_28c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    std::ostream::_M_insert<double>((double)local_290);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar5,(char *)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    sVar1 = local_2c8;
    if (local_2c8 == local_2a8) {
      pcVar6 = "$clr.ambient";
      if (local_2c8 != 0) {
        iVar3 = bcmp(local_2d0,local_2b0,local_2c8);
        pcVar6 = "$clr.ambient";
        if (iVar3 != 0) goto LAB_00486c9d;
      }
    }
    else {
LAB_00486c9d:
      if (sVar1 == local_238) {
        pcVar6 = "$clr.diffuse";
        if (sVar1 != 0) {
          iVar3 = bcmp(local_2d0,local_240,sVar1);
          pcVar6 = "$clr.diffuse";
          if (iVar3 != 0) goto LAB_00486cd7;
        }
      }
      else {
LAB_00486cd7:
        if (sVar1 == local_258) {
          pcVar6 = "$clr.specular";
          if (sVar1 != 0) {
            iVar3 = bcmp(local_2d0,local_260,sVar1);
            pcVar6 = "$clr.specular";
            if (iVar3 != 0) goto LAB_00486d0a;
          }
        }
        else {
LAB_00486d0a:
          if (sVar1 != local_278) goto LAB_00486941;
          pcVar6 = "$clr.emissive";
          if (sVar1 != 0) {
            iVar3 = bcmp(local_2d0,local_280,sVar1);
            pcVar6 = "$clr.emissive";
            if (iVar3 != 0) goto LAB_00486941;
          }
        }
      }
    }
    aiMaterial::AddBinaryProperty(material,&local_1fc,0xc,pcVar6,0,0,aiPTI_Float);
    goto LAB_00486941;
  }
  pLVar5 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[55]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [55])"Invalid material: Pass block start missing near index ");
  std::istream::tellg();
  std::ostream::_M_insert<long>((long)local_1a8);
  std::__cxx11::stringbuf::str();
  Logger::error(pLVar5,(char *)local_2b0);
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0,local_2a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_00486e86:
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,CONCAT71(uStack_2bf,local_2c0) + 1);
  }
  return (bool)((byte)local_284 ^ 1);
LAB_00486de2:
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  if (local_260 != local_250) {
    operator_delete(local_260,local_250[0] + 1);
  }
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0,local_2a0[0] + 1);
  }
  goto LAB_00486e86;
}

Assistant:

bool OgreImporter::ReadPass(const std::string &passName, stringstream &ss, aiMaterial *material)
{
    string linePart;
    ss >> linePart;

    if (linePart != partBlockStart)
    {
        ASSIMP_LOG_ERROR_F( "Invalid material: Pass block start missing near index ", ss.tellg());
        return false;
    }

    ASSIMP_LOG_DEBUG_F("  pass '", passName, "'");

    const string partAmbient     = "ambient";
    const string partDiffuse     = "diffuse";
    const string partSpecular    = "specular";
    const string partEmissive    = "emissive";
    const string partTextureUnit = "texture_unit";

    while(linePart != partBlockEnd)
    {
        ss >> linePart;

        // Skip commented lines
        if (linePart == partComment)
        {
            SkipLine(ss);
            continue;
        }

        // Colors
        /// @todo Support alpha via aiColor4D.
        if (linePart == partAmbient || linePart == partDiffuse || linePart == partSpecular || linePart == partEmissive)
        {
            float r, g, b;
            ss >> r >> g >> b;
            const aiColor3D color(r, g, b);

            ASSIMP_LOG_DEBUG_F( "   ", linePart, " ", r, " ", g, " ", b);

            if (linePart == partAmbient)
            {
                material->AddProperty(&color, 1, AI_MATKEY_COLOR_AMBIENT);
            }
            else if (linePart == partDiffuse)
            {
                material->AddProperty(&color, 1, AI_MATKEY_COLOR_DIFFUSE);
            }
            else if (linePart == partSpecular)
            {
                material->AddProperty(&color, 1, AI_MATKEY_COLOR_SPECULAR);
            }
            else if (linePart == partEmissive)
            {
                material->AddProperty(&color, 1, AI_MATKEY_COLOR_EMISSIVE);
            }
        }
        else if (linePart == partTextureUnit)
        {
            string textureUnitName = SkipLine(ss);
            ReadTextureUnit(Trim(textureUnitName), ss, material);
        }
    }
    return true;
}